

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parse_esis.c
# Opt level: O0

int parse_esis(int *arr_sz,int *reserved_sz,uint32_t **esi_arr,char *p)

{
  int *arr_sz_00;
  ushort **ppuVar1;
  char *in_RCX;
  bool bVar2;
  long ve;
  long v;
  char *endptr;
  uint32_t in_stack_ffffffffffffffbc;
  undefined7 in_stack_ffffffffffffffc0;
  undefined1 in_stack_ffffffffffffffc7;
  int *in_stack_ffffffffffffffc8;
  char *local_28;
  char *local_20;
  
  local_20 = in_RCX;
  while (arr_sz_00 = (int *)strtol(local_20,&local_28,0), local_28 != local_20) {
    local_20 = local_28;
    if (*local_28 == '-') {
      in_stack_ffffffffffffffc8 = (int *)strtol(local_28 + 1,&local_28,0);
      local_20 = local_28;
      for (; (long)arr_sz_00 <= (long)in_stack_ffffffffffffffc8;
          arr_sz_00 = (int *)((long)arr_sz_00 + 1)) {
        append(arr_sz_00,in_stack_ffffffffffffffc8,
               (uint32_t **)CONCAT17(in_stack_ffffffffffffffc7,in_stack_ffffffffffffffc0),
               in_stack_ffffffffffffffbc);
      }
    }
    else {
      append(arr_sz_00,in_stack_ffffffffffffffc8,
             (uint32_t **)CONCAT17(in_stack_ffffffffffffffc7,in_stack_ffffffffffffffc0),
             in_stack_ffffffffffffffbc);
    }
    while( true ) {
      bVar2 = false;
      if (*local_20 != '\0') {
        ppuVar1 = __ctype_b_loc();
        bVar2 = ((*ppuVar1)[(int)*local_20] & 0x2000) != 0;
      }
      if (!bVar2) break;
      local_20 = local_20 + 1;
    }
    if (*local_20 == ',') {
      local_20 = local_20 + 1;
    }
    in_stack_ffffffffffffffc7 = 0;
  }
  return 0;
}

Assistant:

int parse_esis(int* arr_sz,
		int* reserved_sz,
		uint32_t** esi_arr,
		const char* p)
{
	do {
		char* endptr;
		long int v = strtol(p, &endptr, 0);
		if (endptr == p)
			break;
		p = endptr;
		if (*p == '-') {
			/* A range was given, find the end value and
			 * place the entire range in the array.
			 */
			long int ve = strtol(p + 1, &endptr, 0);
			p = endptr;
			while (v <= ve) {
				append(arr_sz, reserved_sz, esi_arr, v);
				++v;
			}
		} else {
			append(arr_sz, reserved_sz, esi_arr, v);
		}
		while (*p != '\0' && isspace(*p))
			++p;
		if (*p == ',')
			++p;
	} while(1);

	return 0;
}